

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerSettings.cpp
# Opt level: O3

void __thiscall SMBusAnalyzerSettings::LoadSettings(SMBusAnalyzerSettings *this,char *settings)

{
  bool calc_pec;
  SimpleArchive text_archive;
  int s;
  bool local_29;
  SimpleArchive local_28 [12];
  SMBusDecodeLevel local_1c;
  
  SimpleArchive::SimpleArchive(local_28);
  SimpleArchive::SetString((char *)local_28);
  SimpleArchive::operator>>(local_28,&this->mSMBDAT);
  SimpleArchive::operator>>(local_28,&this->mSMBCLK);
  SimpleArchive::operator>>(local_28,(int *)&local_1c);
  this->mDecodeLevel = local_1c;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSMBDAT,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSMBCLK,true);
  SimpleArchive::operator>>(local_28,&local_29);
  AnalyzerSettingInterfaceBool::SetValue((bool)((char)this + -0x80));
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_28);
  return;
}

Assistant:

void SMBusAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mSMBDAT;
    text_archive >> mSMBCLK;

    int s;
    text_archive >> s;
    mDecodeLevel = SMBusDecodeLevel( s );

    ClearChannels();

    AddChannel( mSMBDAT, "SMBDAT", true );
    AddChannel( mSMBCLK, "SMBCLK", true );

    bool calc_pec;
    text_archive >> calc_pec;
    mCalculatePECInterface.SetValue( calc_pec );

    UpdateInterfacesFromSettings();
}